

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

date_t duckdb::TimeBucket::WidthConvertibleToMonthsCommon
                 (int32_t bucket_width_months,int32_t ts_months,int32_t origin_months)

{
  int iVar1;
  int32_t iVar2;
  int in_EDX;
  int in_EDI;
  int32_t month;
  int32_t year;
  int32_t result_months;
  int in_stack_00000090;
  int in_stack_00000094;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_14;
  
  iVar1 = SubtractOperatorOverflowCheck::Operation<int,int,int>(in_stack_00000094,in_stack_00000090)
  ;
  local_14 = (iVar1 / in_EDI) * in_EDI;
  if ((iVar1 < 0) && (iVar1 % in_EDI != 0)) {
    local_14 = SubtractOperatorOverflowCheck::Operation<int,int,int>
                         (in_stack_00000094,in_stack_00000090);
  }
  local_14 = in_EDX % in_EDI + local_14;
  if ((local_14 < 0) && (local_14 % 0xc != 0)) {
    local_20 = local_14 / 0xc + 0x7b1;
  }
  else {
    local_20 = local_14 / 0xc + 0x7b2;
  }
  if ((local_14 < 0) && (local_14 % 0xc != 0)) {
    local_24 = local_14 % 0xc + 0xd;
  }
  else {
    local_24 = local_14 % 0xc + 1;
  }
  iVar2 = duckdb::Date::FromDate(local_20,local_24,1);
  return (date_t)iVar2;
}

Assistant:

static inline date_t WidthConvertibleToMonthsCommon(int32_t bucket_width_months, int32_t ts_months,
	                                                    int32_t origin_months) {
		origin_months %= bucket_width_months;
		ts_months = SubtractOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(ts_months, origin_months);

		int32_t result_months = (ts_months / bucket_width_months) * bucket_width_months;
		if (ts_months < 0 && ts_months % bucket_width_months != 0) {
			result_months =
			    SubtractOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(result_months, bucket_width_months);
		}
		result_months += origin_months;

		int32_t year =
		    (result_months < 0 && result_months % 12 != 0) ? 1970 + result_months / 12 - 1 : 1970 + result_months / 12;
		int32_t month =
		    (result_months < 0 && result_months % 12 != 0) ? result_months % 12 + 13 : result_months % 12 + 1;

		return Date::FromDate(year, month, 1);
	}